

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O1

int act_disp_nims(nt_opts *opts)

{
  uint uVar1;
  char **ppcVar2;
  nifti_image *nim;
  field_s *fieldp;
  uint nfields;
  long lVar3;
  long lVar4;
  
  uVar1 = (opts->flist).len;
  nfields = 0x3f;
  if (0 < (int)uVar1) {
    nfields = uVar1;
  }
  if (2 < g_debug) {
    fprintf(_stderr,"-d displaying %d fields for %d nifti datasets...\n",(ulong)nfields,
            (ulong)(uint)(opts->infiles).len);
  }
  if (0 < (opts->infiles).len) {
    lVar4 = 0;
    do {
      nim = nt_image_read(opts,(opts->infiles).list[lVar4],0);
      if (nim == (nifti_image *)0x0) {
        return 1;
      }
      if (0 < g_debug) {
        fprintf(_stdout,"\nheader file \'%s\', num_fields = %d, fields:\n\n",nim->fname,
                (ulong)nfields);
      }
      if ((opts->flist).len < 1) {
        disp_field("all fields:\n",g_nim_fields,nim,nfields,(uint)(0 < g_debug));
      }
      else if (0 < (opts->flist).len) {
        ppcVar2 = (opts->flist).list;
        lVar3 = 0;
        do {
          fieldp = get_nim_field(ppcVar2[lVar3],(uint)(lVar4 == 0));
          if (fieldp != (field_s *)0x0) {
            disp_field((char *)0x0,fieldp,nim,1,(uint)((int)lVar3 == 0 && 0 < g_debug));
          }
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 < (opts->flist).len);
      }
      nifti_image_free(nim);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (opts->infiles).len);
  }
  return 0;
}

Assistant:

int act_disp_nims( nt_opts * opts )
{
   nifti_image *  nim;
   field_s     *  fnim;
   char        ** sptr;
   int            nfields, filenum, fc;

   /* set the number of fields to display */
   nfields = opts->flist.len > 0 ? opts->flist.len : NT_NIM_NUM_FIELDS;

   if( g_debug > 2 )
      fprintf(stderr,"-d displaying %d fields for %d nifti datasets...\n",
              nfields, opts->infiles.len);

   for( filenum = 0; filenum < opts->infiles.len; filenum++ )
   {
      nim = nt_image_read(opts, opts->infiles.list[filenum], 0);
      if( !nim ) return 1;  /* errors are printed from library */

      if( g_debug > 0 )
         fprintf(stdout,"\nheader file '%s', num_fields = %d, fields:\n\n",
                 nim->fname, nfields);

      if( opts->flist.len <= 0 ) /* then display all fields */
         disp_field("all fields:\n", g_nim_fields, nim, nfields, g_debug > 0);
      else  /* print only the requested fields... */
      {
         /* must locate each field before printing it */
         sptr = opts->flist.list;
         for( fc = 0; fc < opts->flist.len; fc++ )
         {
            fnim = get_nim_field(*sptr, filenum == 0);
            if( fnim ) disp_field(NULL, fnim, nim, 1, g_debug > 0 && fc == 0);
            sptr++;
         }
      }

      nifti_image_free(nim);
   }

   return 0;
}